

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O1

object pybind11::detail::get_python_state_dict(void)

{
  error_already_set *this;
  handle in_RDI;
  handle local_20;
  
  (in_RDI.m_ptr)->ob_refcnt = 0;
  local_20.m_ptr = (PyObject *)PyEval_GetBuiltins();
  handle::inc_ref(&local_20);
  object::operator=((object *)in_RDI.m_ptr,(object *)&local_20);
  handle::dec_ref(&local_20);
  if ((in_RDI.m_ptr)->ob_refcnt != 0) {
    return (object)(handle)in_RDI.m_ptr;
  }
  raise_from(_PyExc_SystemError,"pybind11::detail::get_python_state_dict() FAILED");
  this = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this);
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline object get_python_state_dict() {
    object state_dict;
#if PYBIND11_INTERNALS_VERSION <= 4 || PY_VERSION_HEX < 0x03080000 || defined(PYPY_VERSION)
    state_dict = reinterpret_borrow<object>(PyEval_GetBuiltins());
#else
#    if PY_VERSION_HEX < 0x03090000
    PyInterpreterState *istate = _PyInterpreterState_Get();
#    else
    PyInterpreterState *istate = PyInterpreterState_Get();
#    endif
    if (istate) {
        state_dict = reinterpret_borrow<object>(PyInterpreterState_GetDict(istate));
    }
#endif
    if (!state_dict) {
        raise_from(PyExc_SystemError, "pybind11::detail::get_python_state_dict() FAILED");
        throw error_already_set();
    }
    return state_dict;
}